

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Error TT_Get_MM_Blend(TT_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  uint uVar1;
  GX_Blend pGVar2;
  FT_Fixed *pFVar3;
  FT_Error FVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((face->blend == (GX_Blend)0x0) && (FVar4 = TT_Get_MM_Var(face,(FT_MM_Var **)0x0), FVar4 != 0))
  {
    return FVar4;
  }
  pGVar2 = face->blend;
  if ((pGVar2->coords == (FT_Fixed *)0x0) &&
     (FVar4 = tt_set_mm_blend(face,0,(FT_Fixed *)0x0,'\x01'), FVar4 != 0)) {
    return FVar4;
  }
  uVar1 = pGVar2->num_axis;
  uVar5 = (ulong)num_coords;
  if (uVar1 < num_coords) {
    uVar5 = (ulong)uVar1;
  }
  if (face->doblend == '\0') {
    if ((int)uVar5 != 0) {
      uVar6 = (ulong)uVar1;
      if (num_coords <= uVar1) {
        uVar6 = (ulong)num_coords;
      }
      memset(coords,0,uVar6 << 3);
      uVar6 = uVar5;
      goto LAB_00258310;
    }
  }
  else if ((int)uVar5 != 0) {
    pFVar3 = pGVar2->normalizedcoords;
    uVar6 = 0;
    do {
      coords[uVar6] = pFVar3[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    goto LAB_00258310;
  }
  uVar6 = 0;
LAB_00258310:
  if ((uint)uVar6 < num_coords) {
    memset(coords + (uVar6 & 0xffffffff),0,(ulong)(~(uint)uVar6 + num_coords) * 8 + 8);
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Get_MM_Blend( TT_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    FT_Error  error = FT_Err_Ok;
    GX_Blend  blend;
    FT_UInt   i, nc;


    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        return error;
    }

    blend = face->blend;

    if ( !blend->coords )
    {
      /* select default instance coordinates */
      /* if no instance is selected yet      */
      if ( FT_SET_ERROR( tt_set_mm_blend( face, 0, NULL, 1 ) ) )
        return error;
    }

    nc = num_coords;
    if ( num_coords > blend->num_axis )
    {
      FT_TRACE2(( "TT_Get_MM_Blend:"
                  " only using first %d of %d coordinates\n",
                  blend->num_axis, num_coords ));
      nc = blend->num_axis;
    }

    if ( face->doblend )
    {
      for ( i = 0; i < nc; i++ )
        coords[i] = blend->normalizedcoords[i];
    }
    else
    {
      for ( i = 0; i < nc; i++ )
        coords[i] = 0;
    }

    for ( ; i < num_coords; i++ )
      coords[i] = 0;

    return FT_Err_Ok;
  }